

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_aa461::AddLoadInfo(VmModule *module,VmInstruction *inst)

{
  VmConstant *node;
  bool bVar1;
  VmValue **ppVVar2;
  VmConstant *pVVar3;
  VmConstant *pVVar4;
  TypeArray *pTVar5;
  byte local_94;
  byte local_93;
  byte local_92;
  byte local_91;
  TypeArray *typeArray;
  VmConstant *loadAddress;
  VmConstant *loadOffset;
  VmValue *loadPointer;
  LoadStoreInfo info;
  VmInstruction *inst_local;
  VmModule *module_local;
  
  info._80_8_ = inst;
  VmModule::LoadStoreInfo::LoadStoreInfo((LoadStoreInfo *)&loadPointer);
  loadPointer = (VmValue *)info._80_8_;
  info.copyInst._0_4_ = GetAccessSize((VmInstruction *)info._80_8_);
  ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                      ((SmallArray<VmValue_*,_4U> *)(info._80_8_ + 0xa0),0);
  node = (VmConstant *)*ppVVar2;
  ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                      ((SmallArray<VmValue_*,_4U> *)(info._80_8_ + 0xa0),1);
  pVVar3 = getType<VmConstant>(*ppVVar2);
  pVVar4 = getType<VmConstant>((VmValue *)node);
  if (pVVar4 != (VmConstant *)0x0) {
    if (pVVar4->container == (VariableData *)0x0) {
      return;
    }
    if (pVVar3->iValue != 0) {
      __assert_fail("loadOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x5b0,"void (anonymous namespace)::AddLoadInfo(VmModule *, VmInstruction *)");
    }
    pTVar5 = getType<TypeArray>(pVVar4->container->type);
    info._24_8_ = pVVar4;
    node = info.loadAddress;
    pVVar3 = (VmConstant *)info.loadPointer;
    if ((pTVar5 != (TypeArray *)0x0) && (0x20 < pTVar5->length)) {
      return;
    }
  }
  info.loadPointer = &pVVar3->super_VmValue;
  info.loadAddress = node;
  if ((info._24_8_ != 0) || (local_91 = 1, info.loadAddress != (VmConstant *)0x0)) {
    local_92 = 0;
    if ((info._24_8_ != 0) && (local_92 = 0, *(long *)(info._24_8_ + 200) != 0)) {
      bVar1 = HasAddressTaken(*(VariableData **)(info._24_8_ + 200));
      local_92 = bVar1 ^ 0xff;
    }
    local_91 = local_92;
  }
  info.storeOffset._0_1_ = local_91 & 1;
  if ((info.loadOffset != (VmConstant *)0x0) ||
     (local_93 = 1, info.storeAddress != (VmConstant *)0x0)) {
    local_94 = 0;
    if ((info.loadOffset != (VmConstant *)0x0) &&
       (local_94 = 0, (info.loadOffset)->container != (VariableData *)0x0)) {
      bVar1 = HasAddressTaken((info.loadOffset)->container);
      local_94 = bVar1 ^ 0xff;
    }
    local_93 = local_94;
  }
  info.storeOffset._1_1_ = local_93 & 1;
  SmallArray<VmModule::LoadStoreInfo,_32U>::push_back
            (&module->loadStoreInfo,(LoadStoreInfo *)&loadPointer);
  return;
}

Assistant:

void AddLoadInfo(VmModule *module, VmInstruction* inst)
	{
		VmModule::LoadStoreInfo info;

		info.loadInst = inst;

		info.accessSize = GetAccessSize(inst);

		VmValue *loadPointer = inst->arguments[0];
		VmConstant *loadOffset = getType<VmConstant>(inst->arguments[1]);

		if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
		{
			if(!loadAddress->container)
				return;

			assert(loadOffset->iValue == 0);

			// Do not track load-store into large arrays
			if(TypeArray *typeArray = getType<TypeArray>(loadAddress->container->type))
			{
				if(typeArray->length > 32)
					return;
			}

			info.loadAddress = loadAddress;
		}
		else
		{
			info.loadPointer = loadPointer;
			info.loadOffset = loadOffset;
		}

		info.noLoadOrNoContainerAlias = !(info.loadAddress || info.loadPointer) || (info.loadAddress && info.loadAddress->container && !HasAddressTaken(info.loadAddress->container));
		info.noStoreOrNoContainerAlias = !(info.storeAddress || info.storePointer) || (info.storeAddress && info.storeAddress->container && !HasAddressTaken(info.storeAddress->container));

		module->loadStoreInfo.push_back(info);
	}